

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O1

int lls_qr(double *Ai,double *bi,int M,int N,double *xo)

{
  size_t sVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  double *A;
  double *Q;
  double *A_00;
  double *B;
  double *__dest;
  double *pdVar5;
  double *v;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  double dVar23;
  ulong local_78;
  double *local_70;
  double *local_60;
  
  uVar13 = (ulong)(uint)N;
  if (M < N) {
    lVar20 = (long)M;
    sVar11 = N * lVar20 * 8;
    A = (double *)malloc(sVar11);
    sVar1 = lVar20 * 8;
    local_60 = (double *)malloc(sVar1);
    Q = (double *)malloc(sVar11);
    A_00 = (double *)malloc(lVar20 * sVar1);
    B = (double *)malloc(sVar1);
    __dest = (double *)malloc(sVar1);
    if (0 < M) {
      memcpy(__dest,bi,(ulong)(uint)M << 3);
    }
    mtranspose(Ai,M,N,A);
    qrdecomp(A,N,M,local_60);
    getQR(A,N,M,local_60,Q,A_00);
    iVar4 = rank(A_00,M,M);
    itranspose(A_00,M,M);
    *B = *__dest / *A_00;
    if (1 < M) {
      uVar13 = 1;
      pdVar5 = A_00;
      do {
        pdVar5 = pdVar5 + (uint)M;
        dVar23 = 0.0;
        uVar15 = 0;
        do {
          dVar23 = dVar23 + pdVar5[uVar15] * B[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
        B[uVar13] = (__dest[uVar13] - dVar23) / A_00[uVar13 + (uint)((int)uVar13 * M)];
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uint)M);
    }
    mmult(Q,B,xo,N,M,1);
  }
  else {
    lVar20 = (long)M;
    sVar1 = lVar20 * 8;
    pdVar5 = (double *)malloc(sVar1);
    B = (double *)malloc(sVar1);
    lVar21 = (long)N;
    sVar11 = lVar21 * 8;
    Q = (double *)malloc(sVar11);
    v = (double *)malloc(sVar1);
    A = (double *)malloc(sVar1 * lVar21);
    __dest = (double *)malloc(sVar1 * lVar21);
    local_60 = (double *)malloc(sVar11);
    A_00 = (double *)malloc(sVar11 * lVar21);
    uVar15 = (ulong)(uint)M;
    if (0 < M) {
      memcpy(B,bi,uVar15 * 8);
    }
    if (0 < N * M) {
      memcpy(__dest,Ai,(ulong)(uint)(N * M) << 3);
    }
    if (0 < N) {
      lVar19 = uVar13 << 0x20;
      pdVar8 = __dest + uVar13;
      uVar7 = 0;
      uVar12 = uVar13;
      local_78 = uVar15;
      local_70 = __dest;
      do {
        if ((long)uVar7 < lVar20) {
          uVar6 = 0;
          pdVar14 = local_70;
          do {
            pdVar5[uVar6] = *pdVar14;
            uVar6 = uVar6 + 1;
            pdVar14 = pdVar14 + uVar13;
          } while (local_78 != uVar6);
        }
        iVar17 = (int)uVar7;
        iVar4 = M - iVar17;
        dVar23 = house(pdVar5,iVar4,v);
        Q[uVar7] = dVar23;
        if ((long)uVar7 < lVar20) {
          lVar10 = 0;
          pdVar14 = local_70;
          uVar6 = uVar7;
          do {
            uVar16 = 0;
            lVar18 = lVar10;
            do {
              *(double *)((long)A + (lVar18 >> 0x1d)) = pdVar14[uVar16];
              lVar18 = lVar18 + (local_78 << 0x20);
              uVar16 = uVar16 + 1;
            } while (uVar12 != uVar16);
            uVar6 = uVar6 + 1;
            lVar10 = lVar10 + 0x100000000;
            pdVar14 = pdVar14 + uVar13;
          } while (uVar6 != uVar15);
        }
        mmult(A,v,local_60,N - iVar17,iVar4,1);
        scale(local_60,N - iVar17,1,dVar23);
        mmult(v,local_60,A,iVar4,1,N - iVar17);
        if ((long)uVar7 < lVar20) {
          lVar10 = 0;
          pdVar14 = local_70;
          uVar6 = uVar7;
          do {
            uVar16 = 0;
            lVar18 = lVar10;
            do {
              pdVar14[uVar16] = pdVar14[uVar16] - *(double *)((long)A + (lVar18 >> 0x1d));
              uVar16 = uVar16 + 1;
              lVar18 = lVar18 + 0x100000000;
            } while (uVar12 != uVar16);
            uVar6 = uVar6 + 1;
            pdVar14 = pdVar14 + uVar13;
            lVar10 = lVar10 + lVar19;
          } while (uVar6 != uVar15);
        }
        bVar3 = (long)uVar7 < lVar20;
        uVar7 = uVar7 + 1;
        if ((long)uVar7 < lVar20 && bVar3) {
          uVar6 = 1;
          pdVar14 = pdVar8;
          do {
            *pdVar14 = v[uVar6];
            uVar6 = uVar6 + 1;
            pdVar14 = pdVar14 + uVar13;
          } while (local_78 != uVar6);
        }
        local_78 = local_78 - 1;
        local_70 = local_70 + uVar13 + 1;
        uVar12 = uVar12 - 1;
        lVar19 = lVar19 + -0x100000000;
        pdVar8 = pdVar8 + uVar13 + 1;
      } while (uVar7 != uVar13);
      if (0 < N) {
        uVar12 = 0;
        pdVar8 = __dest;
        pdVar14 = A_00;
        do {
          uVar7 = 0;
          do {
            if (uVar7 < uVar12) {
              pdVar14[uVar7] = 0.0;
            }
            else {
              pdVar14[uVar7] = pdVar8[uVar7];
            }
            uVar7 = uVar7 + 1;
          } while (uVar13 != uVar7);
          uVar12 = uVar12 + 1;
          pdVar14 = pdVar14 + uVar13;
          pdVar8 = pdVar8 + uVar13;
        } while (uVar12 != uVar13);
      }
    }
    iVar4 = rank(A_00,N,N);
    if (0 < N) {
      pdVar8 = __dest + uVar13;
      uVar12 = 0;
      pdVar14 = B;
      pdVar22 = v;
      do {
        v[uVar12] = 1.0;
        uVar7 = uVar12 + 1;
        if ((long)uVar7 < lVar20) {
          uVar6 = 1;
          pdVar9 = pdVar8;
          do {
            pdVar22[uVar6] = *pdVar9;
            uVar6 = uVar6 + 1;
            pdVar9 = pdVar9 + uVar13;
          } while (uVar15 != uVar6);
        }
        mmult(B + uVar12,v + uVar12,local_60,1,M - (int)uVar12,1);
        dVar23 = *local_60;
        dVar2 = Q[uVar12];
        *local_60 = dVar23 * dVar2;
        if ((long)uVar12 < lVar20) {
          uVar6 = 0;
          do {
            pdVar22[uVar6] = pdVar22[uVar6] * dVar23 * dVar2;
            uVar6 = uVar6 + 1;
          } while (uVar15 != uVar6);
          if ((long)uVar12 < lVar20) {
            uVar12 = 0;
            do {
              pdVar14[uVar12] = pdVar14[uVar12] - pdVar22[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar15 != uVar12);
          }
        }
        uVar15 = uVar15 - 1;
        pdVar22 = pdVar22 + 1;
        pdVar8 = pdVar8 + uVar13 + 1;
        pdVar14 = pdVar14 + 1;
        uVar12 = uVar7;
      } while (uVar7 != uVar13);
    }
    xo[lVar21 + -1] = B[lVar21 + -1] / A_00[(ulong)(uint)(N * N) - 1];
    if (1 < N) {
      lVar20 = (long)(N + -2);
      pdVar14 = A_00 + lVar20 * (uVar13 + 1) + 1;
      pdVar8 = xo + (N - 1);
      uVar15 = 1;
      do {
        dVar23 = 0.0;
        if (lVar20 < (long)(uVar13 - 1)) {
          uVar12 = 0;
          do {
            pdVar22 = pdVar14 + uVar12;
            pdVar9 = pdVar8 + uVar12;
            uVar12 = uVar12 + 1;
            dVar23 = dVar23 + *pdVar22 * *pdVar9;
          } while (uVar15 != uVar12);
        }
        xo[lVar20] = (B[lVar20] - dVar23) / A_00[lVar20 * (uVar13 + 1)];
        lVar20 = lVar20 + -1;
        uVar15 = uVar15 + 1;
        pdVar14 = (double *)((long)pdVar14 - (uVar13 * 8 + 8));
        pdVar8 = pdVar8 + -1;
      } while (uVar15 != uVar13);
    }
    free(pdVar5);
    free(v);
  }
  free(A);
  free(local_60);
  free(Q);
  free(A_00);
  free(B);
  free(__dest);
  return iVar4;
}

Assistant:

int lls_qr(double *Ai,double *bi,int M,int N,double *xo) {
	int ret;

	if (M >= N) {
		ret = lls_qr_determined(Ai,bi,M,N,xo);
	} else {
		ret = lls_qr_undetermined(Ai,bi,M,N,xo);
	}

	return ret;
}